

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

string * __thiscall
Assimp::XGLImporter::GetElementName_abi_cxx11_(string *__return_storage_ptr__,XGLImporter *this)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  size_t sVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  size_t len;
  char *s;
  XGLImporter *this_local;
  string *ret;
  char *__s;
  
  peVar2 = std::
           __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_reader);
  iVar1 = (*peVar2->_vptr_IIrrXMLReader[0xd])();
  __s = (char *)CONCAT44(extraout_var,iVar1);
  sVar3 = strlen(__s);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<char_const*,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__s,__s + sVar3,__result,tolower);
  return __return_storage_ptr__;
}

Assistant:

std::string XGLImporter::GetElementName()
{
    const char* s  = m_reader->getNodeName();
    size_t len = strlen(s);

    std::string ret;
    ret.resize(len);

    std::transform(s,s+len,ret.begin(),::tolower);
    return ret;
}